

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O2

SectionContribution * __thiscall
llvm::DWARFUnitIndex::Entry::getOffset(Entry *this,DWARFSectionKind Sec)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if ((this->Index->Header).NumColumns == uVar2) {
      return (SectionContribution *)0x0;
    }
    uVar1 = uVar2 + 1;
  } while ((this->Index->ColumnKinds)._M_t.
           super___uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFSectionKind_*,_std::default_delete<llvm::DWARFSectionKind[]>_>
           .super__Head_base<0UL,_llvm::DWARFSectionKind_*,_false>._M_head_impl[uVar2] != Sec);
  return (this->Contributions)._M_t.
         super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
         .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>.
         _M_head_impl + uVar2;
}

Assistant:

const DWARFUnitIndex::Entry::SectionContribution *
DWARFUnitIndex::Entry::getOffset(DWARFSectionKind Sec) const {
  uint32_t i = 0;
  for (; i != Index->Header.NumColumns; ++i)
    if (Index->ColumnKinds[i] == Sec)
      return &Contributions[i];
  return nullptr;
}